

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::BW_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  byte bVar3;
  SQChar *pSVar4;
  SQChar *pSVar5;
  bool bVar6;
  
  if (((o2->super_SQObject)._type | (o1->super_SQObject)._type) != OT_INTEGER) {
    pSVar4 = GetTypeName(o1);
    pSVar5 = GetTypeName(o2);
    Raise_Error(this,"bitwise op between \'%s\' and \'%s\'",pSVar4,pSVar5);
    return false;
  }
  if (6 < op) {
switchD_0012c289_caseD_1:
    bVar6 = false;
    Raise_Error(this,"internal vm error bitwise op failed");
    goto LAB_0012c2fc;
  }
  uVar2 = (o1->super_SQObject)._unVal.nInteger;
  o2 = (SQObjectPtr *)(o2->super_SQObject)._unVal.nInteger;
  bVar3 = (byte)o2;
  switch(op) {
  case 0:
    o2 = (SQObjectPtr *)((ulong)o2 & uVar2);
    break;
  case 1:
    goto switchD_0012c289_caseD_1;
  case 2:
    o2 = (SQObjectPtr *)((ulong)o2 | uVar2);
    break;
  case 3:
    o2 = (SQObjectPtr *)((ulong)o2 ^ uVar2);
    break;
  case 4:
    o2 = (SQObjectPtr *)(uVar2 << (bVar3 & 0x3f));
    goto LAB_0012c2f6;
  case 5:
    o2 = (SQObjectPtr *)((long)uVar2 >> (bVar3 & 0x3f));
    goto LAB_0012c2f6;
  case 6:
    o2 = (SQObjectPtr *)(uVar2 >> (bVar3 & 0x3f));
LAB_0012c2f6:
    bVar6 = true;
    goto LAB_0012c2fc;
  }
  bVar6 = true;
LAB_0012c2fc:
  if (bVar6) {
    if (((trg->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (trg->super_SQObject)._type = OT_INTEGER;
    (trg->super_SQObject)._unVal.pTable = (SQTable *)o2;
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SQVM::BW_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger res;
    if((sq_type(o1)| sq_type(o2)) == OT_INTEGER)
    {
        SQInteger i1 = _integer(o1), i2 = _integer(o2);
        switch(op) {
            case BW_AND:    res = i1 & i2; break;
            case BW_OR:     res = i1 | i2; break;
            case BW_XOR:    res = i1 ^ i2; break;
            case BW_SHIFTL: res = i1 << i2; break;
            case BW_SHIFTR: res = i1 >> i2; break;
            case BW_USHIFTR:res = (SQInteger)(*((SQUnsignedInteger*)&i1) >> i2); break;
            default: { Raise_Error(_SC("internal vm error bitwise op failed")); return false; }
        }
    }
    else { Raise_Error(_SC("bitwise op between '%s' and '%s'"),GetTypeName(o1),GetTypeName(o2)); return false;}
    trg = res;
    return true;
}